

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O0

void __thiscall apollonia::World::Add(World *this,Body *body)

{
  Body *local_18;
  Body *body_local;
  World *this_local;
  
  local_18 = body;
  body_local = (Body *)this;
  std::vector<apollonia::Body_*,_std::allocator<apollonia::Body_*>_>::push_back
            (&this->bodies_,&local_18);
  return;
}

Assistant:

void Add(Body* body) { bodies_.push_back(body); }